

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# natwm.c
# Opt level: O2

void * wm_event_loop(void *passed_state)

{
  logger *log;
  uint __i;
  int iVar1;
  int iVar2;
  natwm_error nVar3;
  long lVar4;
  xcb_generic_event_t *event;
  undefined8 uVar5;
  char *fmt;
  void *pvVar6;
  undefined1 local_d8 [8];
  fd_set fds;
  timespec timeout;
  
  if (passed_state == (void *)0x0) {
    internal_logger(natwm_logger,LEVEL_ERROR,"Received invalid passed state to event loop");
LAB_00103f0d:
    pvVar6 = (void *)0xffffffffffffffff;
  }
  else {
    iVar1 = xcb_get_file_descriptor(*(undefined8 *)((long)passed_state + 8));
    fds.__fds_bits[0xf] = 0;
LAB_00103dd3:
    if (status == 0) {
      for (lVar4 = 0; lVar4 != 0x10; lVar4 = lVar4 + 1) {
        fds.__fds_bits[lVar4 + -1] = 0;
      }
      fds.__fds_bits[(long)(iVar1 / 0x40) + -1] =
           fds.__fds_bits[(long)(iVar1 / 0x40) + -1] | 1L << ((ulong)(uint)(iVar1 % 0x40) & 0x3f);
      iVar2 = xcb_connection_has_error(*(undefined8 *)((long)passed_state + 8));
      if ((iVar2 == 0) || (status != 0)) goto LAB_00103e20;
      fmt = "Connection to X server closed";
      goto LAB_00103ef4;
    }
    pvVar6 = (void *)0x0;
    internal_logger(natwm_logger,LEVEL_INFO,"Disconnected...");
  }
  return pvVar6;
LAB_00103e20:
  iVar2 = pselect(iVar1 + 1,(fd_set *)local_d8,(fd_set *)0x0,(fd_set *)0x0,
                  (timespec *)(fds.__fds_bits + 0xf),(__sigset_t *)0x0);
  if (iVar2 != 0) {
    if (iVar2 < 0) {
      fmt = "pselect failed";
LAB_00103ef4:
      internal_logger(natwm_logger,LEVEL_ERROR,fmt);
      status = -1;
      goto LAB_00103f0d;
    }
    while( true ) {
      event = (xcb_generic_event_t *)xcb_poll_for_event(*(undefined8 *)((long)passed_state + 8));
      if (event == (xcb_generic_event_t *)0x0) break;
      nVar3 = event_handle((natwm_state *)passed_state,event);
      log = natwm_logger;
      if (nVar3 == NO_ERROR) {
        free(event);
        xcb_flush(*(undefined8 *)((long)passed_state + 8));
      }
      else {
        if (nVar3 != NOT_FOUND_ERROR) {
          uVar5 = xcb_event_get_label(event->response_type & 0x7f);
          internal_logger(log,LEVEL_WARNING,"Failed to perform %s",uVar5);
        }
        free(event);
      }
    }
  }
  goto LAB_00103dd3;
}

Assistant:

static void *wm_event_loop(void *passed_state)
{
        struct natwm_state *state = (struct natwm_state *)passed_state;
        xcb_generic_event_t *event = XCB_NONE;

        if (state == NULL) {
                LOG_ERROR(natwm_logger, "Received invalid passed state to event loop");

                return (intptr_t *)-1;
        }

        fd_set fds;
        int xcb_fd = xcb_get_file_descriptor(state->xcb);

        // If there hasn't been an X event in 25 milliseconds then we timeout
        // and check for any interuptions or errors
        struct timespec timeout = {
                .tv_sec = 0,
                .tv_nsec = 25000000, // 25 Milliseconds
        };

        while (status == RUNNING) {
                FD_ZERO(&fds);
                FD_SET(xcb_fd, &fds);

                if (xcb_connection_has_error(state->xcb) && status == RUNNING) {
                        LOG_ERROR(natwm_logger, "Connection to X server closed");

                        goto handle_error;
                }

                int num = pselect(xcb_fd + 1, &fds, NULL, NULL, &timeout, NULL);

                if (num == 0) {
                        // No events to process
                        continue;
                }

                if (num < 0) {
                        LOG_ERROR(natwm_logger, "pselect failed");

                        goto handle_error;
                }

                while ((event = xcb_poll_for_event(state->xcb))) {
                        enum natwm_error err = event_handle(state, event);

                        if (err == NOT_FOUND_ERROR) {
                                free(event);

                                continue;
                        }

                        if (err != NO_ERROR) {
                                uint8_t rtype = event->response_type;
                                uint8_t type = (uint8_t)(GET_EVENT_TYPE(rtype));

                                LOG_WARNING(natwm_logger,
                                            "Failed to perform %s",
                                            xcb_event_get_label(type));

                                free(event);

                                continue;
                        }

                        free(event);

                        xcb_flush(state->xcb);
                }
        }

        // Event loop stopped disconnect from x
        LOG_INFO(natwm_logger, "Disconnected...");

        return (intptr_t *)0;

handle_error:
        status = STOPPED;

        return (intptr_t *)-1;
}